

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O3

double util::rpn_eval_bitor(vector<double,_std::allocator<double>_> *args)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dStack_20;
  
  pdVar1 = (args->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar3 = *pdVar1 + 0.5;
  dVar4 = pdVar1[1] + 0.5;
  auVar2._8_4_ = SUB84(dVar4,0);
  auVar2._0_8_ = dVar3;
  auVar2._12_4_ = (int)((ulong)dVar4 >> 0x20);
  dVar3 = floor(dVar3);
  dStack_20 = auVar2._8_8_;
  dVar4 = floor(dStack_20);
  return (double)((int)dVar4 | (int)dVar3);
}

Assistant:

static double rpn_eval_bitor(std::vector<double> args) { return d2i(args[0]) | d2i(args[1]); }